

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture1DArrayView *src,float *texCoord,ReferenceParams *params)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  byte bVar6;
  bool bVar7;
  ulong uVar8;
  int i;
  int iVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  deInt32 srcSize;
  int iVar16;
  int iVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  Texture1DArrayView TVar22;
  Vector<float,_4> res_1;
  Vec3 triT [2];
  float triLod [2];
  IVec2 dstSize;
  Vec3 triS [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Vector<float,_4> res;
  Texture1DArrayView src_1;
  float local_e8;
  uint uStack_e4;
  undefined8 uStack_e0;
  float local_d8 [8];
  float local_b8 [2];
  Texture1DArrayView local_b0;
  IVec2 local_a0;
  Vec3 local_98;
  Vec3 local_8c;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_78;
  float local_58 [6];
  WrapMode local_40;
  ConstPixelBufferAccess *local_38;
  
  fVar19 = *texCoord;
  fVar20 = texCoord[1];
  fVar1 = texCoord[2];
  fVar21 = texCoord[4];
  fVar2 = texCoord[6];
  fVar3 = texCoord[3];
  fVar4 = texCoord[5];
  fVar5 = texCoord[7];
  local_78.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar22 = tcu::getEffectiveTextureView(src,&local_78,&params->sampler);
  local_38 = TVar22.m_levels;
  local_40 = TVar22.m_numLevels;
  fVar18 = 0.0;
  if (((params->super_RenderParams).flags & 2) != 0) {
    fVar18 = (params->super_RenderParams).bias;
  }
  local_a0.m_data[0] = dst->m_width;
  local_a0.m_data[1] = dst->m_height;
  if ((int)local_40 < 1) {
    srcSize = 0;
  }
  else {
    srcSize = (local_38->m_size).m_data[0];
  }
  local_d8[0] = fVar20;
  local_d8[1] = fVar3;
  local_d8[2] = fVar4;
  local_d8[3] = fVar5;
  local_d8[4] = fVar4;
  local_d8[5] = fVar3;
  local_98.m_data[0] = fVar19;
  local_98.m_data[1] = fVar1;
  local_98.m_data[2] = fVar21;
  local_8c.m_data[0] = fVar2;
  local_8c.m_data[1] = fVar21;
  local_8c.m_data[2] = fVar1;
  local_b8[0] = computeNonProjectedTriLod(params->lodMode,&local_a0,srcSize,&local_98);
  local_b8[0] = local_b8[0] + fVar18;
  fVar19 = computeNonProjectedTriLod(params->lodMode,&local_a0,srcSize,&local_8c);
  local_b8[1] = fVar19 + fVar18;
  if (0 < dst->m_height) {
    iVar16 = 0;
    do {
      iVar9 = dst->m_width;
      if (0 < iVar9) {
        iVar17 = 0;
        do {
          fVar20 = ((float)iVar16 + 0.5) / (float)dst->m_height;
          fVar19 = ((float)iVar17 + 0.5) / (float)iVar9;
          bVar7 = 1.0 <= fVar19 + fVar20;
          if (bVar7) {
            fVar19 = 1.0 - fVar19;
            fVar20 = 1.0 - fVar20;
          }
          uVar8 = (ulong)bVar7;
          fVar1 = (&local_98)[uVar8].m_data[0];
          fVar21 = ((&local_98)[uVar8].m_data[1] - fVar1) * fVar20 +
                   ((&local_8c)[uVar8 - 1].m_data[2] - fVar1) * fVar19 + fVar1;
          fVar1 = local_d8[uVar8 * 3];
          fVar19 = (local_d8[uVar8 * 3 + 1] - fVar1) * fVar20 +
                   (local_d8[uVar8 * 3 + 2] - fVar1) * fVar19 + fVar1;
          if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
            local_b0.m_numLevels =
                 (int)tcu::Texture1DArrayView::sampleCompare
                                ((Texture1DArrayView *)&local_40,&params->sampler,
                                 (params->super_RenderParams).ref,fVar21,fVar19,local_b8[uVar8]);
            local_b0._4_8_ = 0;
            local_b0.m_levels._4_4_ = 0x3f800000;
          }
          else {
            tcu::Texture1DArrayView::sample
                      (&local_b0,(Sampler *)&local_40,fVar21,fVar19,local_b8[uVar8]);
          }
          local_58[0] = 0.0;
          local_58[1] = 0.0;
          local_58[2] = 0.0;
          local_58[3] = 0.0;
          lVar11 = 0;
          do {
            local_58[lVar11] =
                 (float)(&local_b0.m_numLevels)[lVar11] *
                 (params->super_RenderParams).colorScale.m_data[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          _local_e8 = 0;
          uStack_e0 = 0;
          lVar11 = 0;
          do {
            (&local_e8)[lVar11] =
                 local_58[lVar11] + (params->super_RenderParams).colorBias.m_data[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          bVar6 = dst->m_colorMask;
          uVar10 = 0;
          uVar15 = 0;
          if ((bVar6 & 1) != 0) {
            uVar12 = 0x7e - ((int)local_e8 >> 0x17);
            uVar15 = (((uint)local_e8 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar12 & 0x1f)) +
                     0x800000;
            if (8 < uVar12) {
              uVar15 = uVar12;
            }
            uVar15 = uVar15 >> 0x18;
          }
          if ((bVar6 & 2) != 0) {
            uVar12 = 0x7e - ((int)uStack_e4 >> 0x17);
            uVar10 = ((uStack_e4 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar12 & 0x1f)) +
                     0x800000;
            if (8 < uVar12) {
              uVar10 = uVar12;
            }
            uVar10 = uVar10 >> 0x10 & 0xff00;
          }
          uVar12 = 0;
          if ((bVar6 & 4) != 0) {
            uVar13 = 0x7e - ((int)(uint)uStack_e0 >> 0x17);
            uVar12 = (((uint)uStack_e0 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar13 & 0x1f)) +
                     0x800000;
            if (8 < uVar13) {
              uVar12 = uVar13;
            }
            uVar12 = uVar12 >> 8 & 0xff0000;
          }
          uVar13 = 0xff000000;
          if ((bVar6 & 8) != 0) {
            uVar14 = 0x7e - ((int)uStack_e0._4_4_ >> 0x17);
            uVar13 = ((uStack_e0._4_4_ & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar14 & 0x1f)) +
                     0x800000;
            if (8 < uVar14) {
              uVar13 = uVar14;
            }
            uVar13 = uVar13 & 0xff000000;
          }
          *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                   (long)((dst->m_y + iVar16) * dst->m_surface->m_width + dst->m_x + iVar17) * 4) =
               uVar10 | uVar15 | uVar12 | uVar13;
          iVar17 = iVar17 + 1;
          iVar9 = dst->m_width;
        } while (iVar17 < iVar9);
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 < dst->m_height);
  }
  if (local_78.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture1DArrayView& src, const float* texCoord, const ReferenceParams& params)
{
	tcu::Vec4 sq = tcu::Vec4(texCoord[0+0], texCoord[2+0], texCoord[4+0], texCoord[6+0]);
	tcu::Vec4 tq = tcu::Vec4(texCoord[0+1], texCoord[2+1], texCoord[4+1], texCoord[6+1]);

	DE_ASSERT(!(params.flags & ReferenceParams::PROJECTED)); // \todo [2014-06-09 mika] Support projected lookups.
	sampleTextureNonProjected(dst, src, sq, tq, params);
}